

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_are_all_used_components_decoded(opj_j2k_t *p_j2k,opj_event_mgr_t *p_manager)

{
  bool bVar1;
  opj_image_t *poVar2;
  long lVar3;
  ulong uVar4;
  
  if ((p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode == 0) {
    poVar2 = p_j2k->m_output_image;
    if (poVar2->numcomps != 0) {
      bVar1 = true;
      lVar3 = 0x30;
      uVar4 = 0;
      do {
        if (*(long *)((long)&poVar2->comps->dx + lVar3) == 0) {
          bVar1 = false;
          opj_event_msg(p_manager,2,"Failed to decode component %d\n",uVar4 & 0xffffffff);
        }
        uVar4 = uVar4 + 1;
        poVar2 = p_j2k->m_output_image;
        lVar3 = lVar3 + 0x40;
      } while (uVar4 < poVar2->numcomps);
      goto LAB_00121363;
    }
  }
  else if ((p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode != 0) {
    bVar1 = true;
    uVar4 = 0;
    do {
      if (p_j2k->m_output_image->comps
          [(p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode[uVar4]].data ==
          (OPJ_INT32 *)0x0) {
        bVar1 = false;
        opj_event_msg(p_manager,2,"Failed to decode component %d\n");
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode);
    goto LAB_00121363;
  }
  bVar1 = true;
LAB_00121363:
  if (!bVar1) {
    opj_event_msg(p_manager,1,"Failed to decode all used components\n");
  }
  return (uint)bVar1;
}

Assistant:

static OPJ_BOOL opj_j2k_are_all_used_components_decoded(opj_j2k_t *p_j2k,
        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 compno;
    OPJ_BOOL decoded_all_used_components = OPJ_TRUE;

    if (p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode) {
        for (compno = 0;
                compno < p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode; compno++) {
            OPJ_UINT32 dec_compno =
                p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode[compno];
            if (p_j2k->m_output_image->comps[dec_compno].data == NULL) {
                opj_event_msg(p_manager, EVT_WARNING, "Failed to decode component %d\n",
                              dec_compno);
                decoded_all_used_components = OPJ_FALSE;
            }
        }
    } else {
        for (compno = 0; compno < p_j2k->m_output_image->numcomps; compno++) {
            if (p_j2k->m_output_image->comps[compno].data == NULL) {
                opj_event_msg(p_manager, EVT_WARNING, "Failed to decode component %d\n",
                              compno);
                decoded_all_used_components = OPJ_FALSE;
            }
        }
    }

    if (decoded_all_used_components == OPJ_FALSE) {
        opj_event_msg(p_manager, EVT_ERROR, "Failed to decode all used components\n");
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}